

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3LcsIteratorAdvance(LcsIterator *pIter)

{
  int iVar1;
  char *pcVar2;
  sqlite3_int64 iRead;
  ulong local_20;
  
  pcVar2 = pIter->pRead;
  iVar1 = sqlite3Fts3GetVarint(pcVar2,(sqlite_int64 *)&local_20);
  if (1 < local_20) {
    pcVar2 = pcVar2 + iVar1;
    pIter->iPos = pIter->iPos + (int)local_20 + -2;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  pIter->pRead = pcVar2;
  return (uint)(1 >= local_20);
}

Assistant:

static int fts3LcsIteratorAdvance(LcsIterator *pIter){
  char *pRead = pIter->pRead;
  sqlite3_int64 iRead;
  int rc = 0;

  pRead += sqlite3Fts3GetVarint(pRead, &iRead);
  if( iRead==0 || iRead==1 ){
    pRead = 0;
    rc = 1;
  }else{
    pIter->iPos += (int)(iRead-2);
  }

  pIter->pRead = pRead;
  return rc;
}